

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

bool slang::syntax::ConfigRuleClauseSyntax::isKind(SyntaxKind kind)

{
  return (kind & ~SyntaxList) == ConfigLiblist;
}

Assistant:

bool ConfigRuleClauseSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::ConfigLiblist:
        case SyntaxKind::ConfigUseClause:
            return true;
        default:
            return false;
    }
}